

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
          *enum_generators,
          vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          *extension_generators)

{
  int iVar1;
  vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  *pvVar2;
  int iVar3;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *this_00;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *this_01;
  ExtensionGenerator *local_40;
  int local_34;
  EnumGenerator *pEStack_30;
  int i_1;
  int local_24;
  vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  *pvStack_20;
  int i;
  vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  *extension_generators_local;
  vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  *enum_generators_local;
  MessageGenerator *this_local;
  
  local_24 = 0;
  pvStack_20 = extension_generators;
  extension_generators_local =
       (vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
        *)enum_generators;
  enum_generators_local =
       (vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
        *)this;
  while( true ) {
    iVar1 = local_24;
    iVar3 = Descriptor::enum_type_count(this->descriptor_);
    pvVar2 = extension_generators_local;
    if (iVar3 <= iVar1) break;
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator[](&this->enum_generators_,(long)local_24);
    pEStack_30 = internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::get(this_00);
    std::
    vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
    ::push_back((vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                 *)pvVar2,&stack0xffffffffffffffd0);
    local_24 = local_24 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = local_34;
    iVar3 = Descriptor::extension_count(this->descriptor_);
    pvVar2 = pvStack_20;
    if (iVar3 <= iVar1) break;
    this_01 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_34);
    local_40 = internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::get
                         (this_01);
    std::
    vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
    ::push_back(pvVar2,&local_40);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<EnumGenerator*>* enum_generators,
    std::vector<ExtensionGenerator*>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators->push_back(enum_generators_[i].get());
  }
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators->push_back(extension_generators_[i].get());
  }
}